

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

SIMDShift * __thiscall MixedArena::alloc<wasm::SIMDShift>(MixedArena *this)

{
  SIMDShift *pSVar1;
  
  pSVar1 = (SIMDShift *)allocSpace(this,0x28,8);
  pSVar1->shift = (Expression *)0x0;
  *(undefined8 *)&(pSVar1->super_SpecificExpression<(wasm::Expression::Id)33>).super_Expression = 0;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)33>).super_Expression.type.id = 0;
  *(undefined8 *)&pSVar1->op = 0;
  pSVar1->vec = (Expression *)0x0;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)33>).super_Expression._id = SIMDShiftId;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }